

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall tchecker::clockbounds::df_solver_t::df_solver_t(df_solver_t *this,system_t *system)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  process_id_t pVar4;
  size_t sVar5;
  array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  invalid_argument *this_01;
  element_type *this_02;
  reference pvVar6;
  ulong uVar7;
  db_t *pdVar8;
  undefined1 local_40 [24];
  loc_id_t id;
  allocator<unsigned_int> local_1d;
  value_type_conflict2 local_1c;
  system_t *local_18;
  system_t *system_local;
  df_solver_t *this_local;
  
  local_18 = system;
  system_local = (system_t *)this;
  sVar5 = tchecker::system::locs_t::locations_count
                    (&(system->super_system_t).super_system_t.super_locs_t);
  this->_loc_number = (loc_id_t)sVar5;
  this_00 = &tchecker::system::clocks_t::clock_variables((clocks_t *)local_18)->
             super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  sVar5 = array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(this_00,VK_FLATTENED);
  this->_clock_number = (clock_id_t)sVar5;
  uVar1 = this->_loc_number;
  local_1c = 0;
  std::allocator<unsigned_int>::allocator(&local_1d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->_loc_pid,(ulong)uVar1,&local_1c,&local_1d);
  std::allocator<unsigned_int>::~allocator(&local_1d);
  this->_dim = (ulong)(this->_loc_number * this->_clock_number + 1);
  this->_L = (db_t *)0x0;
  this->_U = (db_t *)0x0;
  this->_updated_L = false;
  this->_updated_U = false;
  if (((this->_loc_number != 0) && (this->_clock_number != 0)) &&
     ((this->_dim < (ulong)this->_loc_number || (this->_dim < (ulong)this->_clock_number)))) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"invalid number of clocks or locations (overflow)");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  for (local_40._16_4_ = 0; (uint)local_40._16_4_ < this->_loc_number;
      local_40._16_4_ = local_40._16_4_ + 1) {
    tchecker::system::locs_t::location((locs_t *)local_40,(int)local_18 + 0x230);
    this_02 = std::
              __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
    pVar4 = tchecker::system::loc_t::pid(this_02);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->_loc_pid,(ulong)(uint)local_40._16_4_);
    *pvVar6 = pVar4;
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)local_40);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->_dim * this->_dim;
  uVar7 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar8 = (db_t *)operator_new__(uVar7);
  this->_L = pdVar8;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->_dim * this->_dim;
  uVar7 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar8 = (db_t *)operator_new__(uVar7);
  this->_U = pdVar8;
  clear(this);
  return;
}

Assistant:

df_solver_t::df_solver_t(tchecker::ta::system_t const & system)
    : _loc_number(system.locations_count()), _clock_number(system.clock_variables().size(tchecker::VK_FLATTENED)),
      _loc_pid(_loc_number, 0),
      _dim(1 + _loc_number * _clock_number), // 1 variable for each clock in each location, plus 1 for dummy clock 0
      _L(nullptr), _U(nullptr), _updated_L(false), _updated_U(false)
{
  if ((_loc_number > 0) && (_clock_number > 0) && ((_dim < _loc_number) || (_dim < _clock_number)))
    throw std::invalid_argument("invalid number of clocks or locations (overflow)");

  for (tchecker::loc_id_t id = 0; id < _loc_number; ++id)
    _loc_pid[id] = system.location(id)->pid();

  _L = new tchecker::dbm::db_t[_dim * _dim];
  _U = new tchecker::dbm::db_t[_dim * _dim];
  clear();
}